

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_flags nk_chart_push_slot(nk_context *ctx,float value,int slot)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  nk_window *win;
  nk_flags flags;
  nk_window *in_stack_00000030;
  nk_context *in_stack_00000038;
  nk_flags local_1c;
  nk_flags local_4;
  
  if (((in_RDI == 0) || (*(long *)(in_RDI + 0x40d8) == 0)) || (3 < in_ESI)) {
    local_4 = 0;
  }
  else if (in_ESI < *(int *)(*(long *)(*(long *)(in_RDI + 0x40d8) + 0xa8) + 0xf8)) {
    if (*(int *)(*(long *)(*(long *)(in_RDI + 0x40d8) + 0xa8) + 0xf8) < in_ESI) {
      local_4 = 0;
    }
    else {
      iVar1 = *(int *)(*(long *)(*(long *)(in_RDI + 0x40d8) + 0xa8) + 0x10c + (long)in_ESI * 0x28);
      if (iVar1 == 0) {
        local_1c = nk_chart_push_line(in_stack_00000038,in_stack_00000030,(nk_chart *)ctx,value,slot
                                     );
      }
      else if (iVar1 == 1) {
        local_1c = nk_chart_push_column
                             (in_stack_00000038,in_stack_00000030,(nk_chart *)ctx,value,slot);
      }
      else {
        local_1c = 0;
      }
      local_4 = local_1c;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

NK_API nk_flags
nk_chart_push_slot(struct nk_context *ctx, float value, int slot)
{
nk_flags flags;
struct nk_window *win;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(slot >= 0 && slot < NK_CHART_MAX_SLOT);
NK_ASSERT(slot < ctx->current->layout->chart.slot);
if (!ctx || !ctx->current || slot >= NK_CHART_MAX_SLOT) return nk_false;
if (slot >= ctx->current->layout->chart.slot) return nk_false;

win = ctx->current;
if (win->layout->chart.slot < slot) return nk_false;
switch (win->layout->chart.slots[slot].type) {
case NK_CHART_LINES:
flags = nk_chart_push_line(ctx, win, &win->layout->chart, value, slot); break;
case NK_CHART_COLUMN:
flags = nk_chart_push_column(ctx, win, &win->layout->chart, value, slot); break;
default:
case NK_CHART_MAX:
flags = 0;
}
return flags;
}